

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayUsageGroup::init
          (SingleVertexArrayUsageGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  int t;
  Usage usage_;
  GLValue max_;
  SingleVertexArrayUsageGroup *this_00;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_01;
  long *plVar6;
  ulong *puVar7;
  int **ppiVar8;
  InputType type;
  ulong uVar9;
  int *piVar10;
  undefined8 uVar11;
  long lVar12;
  GLValue GVar13;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_198 [16];
  pointer local_188;
  pointer pAStack_180;
  pointer local_178;
  long local_170;
  long *local_168;
  undefined8 local_160;
  long local_158;
  undefined8 uStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  uint local_124;
  long local_120;
  SingleVertexArrayUsageGroup *local_118;
  string local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_170 = 0;
  local_118 = this;
  do {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_120 = 0;
    do {
      local_124 = (uint)in_RAX;
      lVar12 = 0;
      do {
        if (lVar12 == 4) {
          type = (&DAT_01bc2720)[local_170];
          iVar2 = deqp::gls::Array::inputTypeSize(type);
          iVar2 = iVar2 * 2;
        }
        else {
          iVar2 = *(int *)((long)&DAT_01bc2750 + lVar12);
          type = (&DAT_01bc2720)[local_170];
        }
        iVar3 = deqp::gls::Array::inputTypeSize(type);
        typeToString<int>(&local_70,iVar2);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1c651c1);
        local_d0 = &local_c0;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar4[3];
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*plVar4;
        }
        local_c8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_148 = &local_138;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_138 = *puVar7;
          lStack_130 = plVar4[3];
        }
        else {
          local_138 = *puVar7;
          local_148 = (ulong *)*plVar4;
        }
        local_140 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        deqp::gls::Array::inputTypeToString_abi_cxx11_
                  (&local_f0,(Array *)(ulong)type,(InputType)local_140);
        uVar9 = 0xf;
        if (local_148 != &local_138) {
          uVar9 = local_138;
        }
        if (uVar9 < local_f0._M_string_length + local_140) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            uVar11 = local_f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_f0._M_string_length + local_140) goto LAB_0138ef63;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_0138ef63:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_148,(ulong)local_f0._M_dataplus._M_p);
        }
        local_198._0_8_ = &local_188;
        ppAVar1 = (pointer *)(puVar5 + 2);
        if ((pointer *)*puVar5 == ppAVar1) {
          local_188 = *ppAVar1;
          pAStack_180 = (pointer)puVar5[3];
        }
        else {
          local_188 = *ppAVar1;
          local_198._0_8_ = (pointer *)*puVar5;
        }
        local_198._8_8_ = puVar5[1];
        *puVar5 = ppAVar1;
        puVar5[1] = 0;
        *(undefined1 *)ppAVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append(local_198);
        local_b0._0_8_ = &local_a0;
        ppiVar8 = (int **)(plVar4 + 2);
        if ((int **)*plVar4 == ppiVar8) {
          local_a0 = *ppiVar8;
          lStack_98 = plVar4[3];
        }
        else {
          local_a0 = *ppiVar8;
          local_b0._0_8_ = (int **)*plVar4;
        }
        local_b0._8_8_ = plVar4[1];
        *plVar4 = (long)ppiVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        t = (&DAT_01bc2920)[local_120];
        typeToString<int>(&local_110,t);
        piVar10 = (int *)0xf;
        if ((int **)local_b0._0_8_ != &local_a0) {
          piVar10 = local_a0;
        }
        if (piVar10 < (int *)(local_110._M_string_length + local_b0._8_8_)) {
          uVar11 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            uVar11 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < (int *)(local_110._M_string_length + local_b0._8_8_))
          goto LAB_0138f0b6;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_b0._0_8_);
        }
        else {
LAB_0138f0b6:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_b0,(ulong)local_110._M_dataplus._M_p);
        }
        local_168 = &local_158;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_158 = *plVar4;
          uStack_150 = puVar5[3];
        }
        else {
          local_158 = *plVar4;
          local_168 = (long *)*puVar5;
        }
        local_160 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_b0._0_8_ != &local_a0) {
          operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
        }
        if ((pointer *)local_198._0_8_ != &local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)((long)&local_188->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        usage_ = local_118->m_usage;
        GVar13 = deqp::gls::GLValue::getMinValue(type);
        aStack_38 = GVar13.field_1;
        local_40 = GVar13.type;
        GVar13 = deqp::gls::GLValue::getMaxValue(type);
        aStack_48 = GVar13.field_1;
        local_50 = GVar13.type;
        max_._4_4_ = uStack_4c;
        max_.type = local_50;
        GVar13._4_4_ = uStack_3c;
        GVar13.type = local_40;
        GVar13.field_1 = aStack_38;
        max_.field_1 = aStack_48;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_b0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,iVar2,false,
                   GVar13,max_);
        local_188 = (pointer)0x0;
        pAStack_180 = (pointer)0x0;
        local_178 = (pointer)0x0;
        local_198._4_4_ = t;
        local_198._0_4_ = PRIMITIVE_TRIANGLES;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_188,(iterator)0x0,(ArraySpec *)local_b0);
        this_00 = local_118;
        if (iVar2 % iVar3 != 0) {
          this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_01,(this_00->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this_00->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_198,(char *)local_168,(char *)local_168);
          tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,local_158 + 1);
        }
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      local_120 = 1;
      in_RAX = 0;
    } while ((local_124 & 1) != 0);
    local_170 = local_170 + 1;
    if (local_170 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayUsageGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const int			stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
				const bool			aligned	= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
				const std::string	name	= "stride" + typeToString(stride) + "_" + Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																m_usage,
																2,
																0,
																stride,
																false,
																GLValue::getMinValue(inputTypes[inputTypeNdx]),
																GLValue::getMaxValue(inputTypes[inputTypeNdx]));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (!aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}